

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

bool __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
try_left_most_traversal
          (iterator *this,olc_node_ptr node,read_critical_section *parent_critical_section)

{
  optimistic_lock *poVar1;
  __atomic_base<unsigned_long> this_00;
  bool bVar2;
  node_type type;
  bool bVar3;
  atomic<long> *paVar4;
  version_type vVar5;
  undefined1 local_1d0 [8];
  iter_result t;
  olc_inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode;
  undefined1 auStack_190 [3];
  node_type node_type;
  read_critical_section node_critical_section;
  read_critical_section *parent_critical_section_local;
  iterator *this_local;
  olc_node_ptr node_local;
  bool result_3;
  bool result;
  bool result_1;
  bool result_4;
  bool result_5;
  version_type local_d8;
  version_tag_type local_d0;
  byte local_c1;
  optimistic_lock *poStack_c0;
  bool result_2;
  version_type local_b8;
  long local_b0;
  __int_type_conflict old_value_1;
  long local_a0;
  __int_type_conflict old_value;
  long local_90;
  memory_order local_88;
  int local_84;
  memory_order __b;
  long local_78;
  memory_order local_70;
  int local_6c;
  memory_order __b_1;
  undefined4 local_60;
  undefined4 local_5c;
  long local_58;
  undefined8 local_50;
  undefined4 local_44;
  undefined8 local_40;
  atomic<long> *local_38;
  long local_30;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  atomic<long> *local_10;
  
  node_critical_section.version.version = (version_tag_type)parent_critical_section;
  this_local = (iterator *)node.tagged_ptr;
  bVar2 = optimistic_lock::read_critical_section::check(parent_critical_section);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    do {
      bVar2 = detail::basic_node_ptr<unodb::detail::olc_node_header>::operator==
                        ((basic_node_ptr<unodb::detail::olc_node_header> *)&this_local,
                         (nullptr_t)0x0);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("node != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                      ,0x9fd,
                      "bool unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::try_left_most_traversal(detail::olc_node_ptr, optimistic_lock::read_critical_section &) [Key = unsigned long, Value = std::span<const std::byte>]"
                     );
      }
      detail::node_ptr_lock((olc_node_ptr *)&this_local);
      optimistic_lock::try_read_lock((optimistic_lock *)auStack_190);
      bVar2 = optimistic_lock::read_critical_section::must_restart
                        ((read_critical_section *)auStack_190);
      vVar5 = node_critical_section.version;
      if (bVar2) {
        node_local.tagged_ptr._7_1_ = 0;
        bVar2 = true;
      }
      else {
        poVar1 = *(optimistic_lock **)node_critical_section.version.version;
        local_b8.version = *(version_tag_type *)(node_critical_section.version.version + 8);
        paVar4 = &poVar1->read_lock_count;
        local_84 = 2;
        poStack_c0 = poVar1;
        ___b = paVar4;
        local_88 = std::operator&(acquire,__memory_order_mask);
        if (local_84 - 1U < 2) {
          local_90 = (paVar4->super___atomic_base<long>)._M_i;
        }
        else if (local_84 == 5) {
          local_90 = (paVar4->super___atomic_base<long>)._M_i;
        }
        else {
          local_90 = (paVar4->super___atomic_base<long>)._M_i;
        }
        if (local_90 < 1) {
          __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
        }
        local_60 = 2;
        local_d0 = (version_tag_type)
                   optimistic_lock::atomic_version_type::load_relaxed(&poVar1->version);
        local_c1 = optimistic_lock::version_type::operator==(&local_b8,(version_type)local_d0);
        if (((local_c1 ^ 0xff) & 1) != 0) {
          optimistic_lock::dec_read_lock_count(poVar1);
        }
        if ((local_c1 & 1) != 0) {
          local_38 = &poVar1->read_lock_count;
          local_40 = 1;
          local_44 = 3;
          local_50 = 1;
          LOCK();
          local_a0 = (local_38->super___atomic_base<long>)._M_i;
          (local_38->super___atomic_base<long>)._M_i =
               (local_38->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          old_value = (__int_type_conflict)poVar1;
          local_58 = local_a0;
          if (local_a0 < 1) {
            __assert_fail("old_value > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                          ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
          }
        }
        *(undefined8 *)vVar5.version = 0;
        if (((local_c1 & 1 ^ 0xff) & 1) == 0) {
          type = detail::basic_node_ptr<unodb::detail::olc_node_header>::type
                           ((basic_node_ptr<unodb::detail::olc_node_header> *)&this_local);
          if (type == LEAF) {
            bVar2 = try_push_leaf(this,(olc_node_ptr)this_local,(read_critical_section *)auStack_190
                                 );
            this_00._M_i = _auStack_190;
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              poVar1 = (optimistic_lock *)_auStack_190;
              paVar4 = (atomic<long> *)(_auStack_190 + 8);
              local_6c = 2;
              ___b_1 = paVar4;
              local_70 = std::operator&(acquire,__memory_order_mask);
              if (local_6c - 1U < 2) {
                local_78 = (paVar4->super___atomic_base<long>)._M_i;
              }
              else if (local_6c == 5) {
                local_78 = (paVar4->super___atomic_base<long>)._M_i;
              }
              else {
                local_78 = (paVar4->super___atomic_base<long>)._M_i;
              }
              if (local_78 < 1) {
                __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                              ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
              }
              local_5c = 2;
              vVar5 = optimistic_lock::atomic_version_type::load_relaxed
                                ((atomic_version_type *)this_00._M_i);
              bVar3 = optimistic_lock::version_type::operator==(&local_d8,vVar5);
              if (((bVar3 ^ 0xffU) & 1) != 0) {
                optimistic_lock::dec_read_lock_count((optimistic_lock *)this_00._M_i);
              }
              if (bVar3) {
                local_10 = (atomic<long> *)(this_00._M_i + 8);
                local_18 = 1;
                local_1c = 3;
                local_28 = 1;
                LOCK();
                local_b0 = (local_10->super___atomic_base<long>)._M_i;
                (local_10->super___atomic_base<long>)._M_i =
                     (local_10->super___atomic_base<long>)._M_i + -1;
                UNLOCK();
                old_value_1 = (__int_type_conflict)poVar1;
                local_30 = local_b0;
                if (local_b0 < 1) {
                  __assert_fail("old_value > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
                }
              }
              _auStack_190 = 0;
              bVar2 = true;
              node_local.tagged_ptr._7_1_ = bVar3;
            }
            else {
              node_local.tagged_ptr._7_1_ = 0;
              bVar2 = true;
            }
          }
          else {
            t.prefix = (key_prefix_snapshot)
                       detail::basic_node_ptr<unodb::detail::olc_node_header>::
                       ptr<unodb::detail::olc_inode<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                                 ((basic_node_ptr<unodb::detail::olc_node_header> *)&this_local);
            detail::
            basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
            ::begin((iter_result *)local_1d0,
                    (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                     *)t.prefix,type);
            bVar2 = optimistic_lock::read_critical_section::check
                              ((read_critical_section *)auStack_190);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              bVar2 = try_push(this,(iter_result *)local_1d0,(read_critical_section *)auStack_190);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                this_local = (iterator *)
                             detail::
                             basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                             ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                          *)t.prefix,type,t.node.tagged_ptr._1_1_);
                bVar2 = optimistic_lock::read_critical_section::check
                                  ((read_critical_section *)auStack_190);
                if (((bVar2 ^ 0xffU) & 1) == 0) {
                  optimistic_lock::read_critical_section::operator=
                            ((read_critical_section *)node_critical_section.version.version,
                             (read_critical_section *)auStack_190);
                  bVar2 = false;
                }
                else {
                  node_local.tagged_ptr._7_1_ = 0;
                  bVar2 = true;
                }
              }
              else {
                node_local.tagged_ptr._7_1_ = 0;
                bVar2 = true;
              }
            }
            else {
              node_local.tagged_ptr._7_1_ = 0;
              bVar2 = true;
            }
          }
        }
        else {
          node_local.tagged_ptr._7_1_ = 0;
          bVar2 = true;
        }
      }
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)auStack_190);
    } while (!bVar2);
  }
  else {
    spin_wait_loop_body();
    node_local.tagged_ptr._7_1_ = 0;
  }
  return (bool)(node_local.tagged_ptr._7_1_ & 1);
}

Assistant:

bool olc_db<Key, Value>::iterator::try_left_most_traversal(
    detail::olc_node_ptr node,
    optimistic_lock::read_critical_section& parent_critical_section) {
  // A check() is required before acting on [node] by taking the lock.
  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }
  while (true) {
    UNODB_DETAIL_ASSERT(node != nullptr);
    // Lock version chaining (node and parent)
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart()))
      return false;  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return false;  // LCOV_EXCL_LINE
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      if (UNODB_DETAIL_UNLIKELY(!try_push_leaf(node, node_critical_section)))
        return false;  // LCOV_EXCL_LINE
      return UNODB_DETAIL_LIKELY(node_critical_section.try_read_unlock());
    }
    // recursive descent.
    auto* const inode{node.ptr<inode_type*>()};
    const auto t =
        inode->begin(node_type);  // first chold of current internal node
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))
      return false;  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!try_push(t, node_critical_section)))
      return false;                                     // LCOV_EXCL_LINE
    node = inode->get_child(node_type, t.child_index);  // get child
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))  // before using
      return false;  // LCOV_EXCL_LINE
    // Move RCS (will check invariant at top of loop)
    parent_critical_section = std::move(node_critical_section);
  }
  UNODB_DETAIL_CANNOT_HAPPEN();
}